

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

size_t __thiscall
polyscope::render::ManagedBuffer<unsigned_int>::size(ManagedBuffer<unsigned_int> *this)

{
  CanonicalDataSource CVar1;
  element_type *this_00;
  long in_RDI;
  size_t s;
  ManagedBuffer<unsigned_int> *in_stack_00000038;
  undefined8 local_18;
  undefined8 local_8;
  
  CVar1 = currentCanonicalDataSource(in_stack_00000038);
  if (CVar1 == HostData) {
    local_8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x38));
  }
  else if (CVar1 == NeedsCompute) {
    local_8 = 0;
  }
  else if (CVar1 == RenderBuffer) {
    if (*(int *)(in_RDI + 0x90) == 0) {
      this_00 = std::
                __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x423ecb);
      local_8 = AttributeBuffer::getDataSize(this_00);
    }
    else {
      local_18 = 1;
      if (*(int *)(in_RDI + 0x94) != 0) {
        local_18 = (size_type)*(uint *)(in_RDI + 0x94);
      }
      if (*(int *)(in_RDI + 0x98) != 0) {
        local_18 = *(uint *)(in_RDI + 0x98) * local_18;
      }
      if (*(int *)(in_RDI + 0x9c) != 0) {
        local_18 = *(uint *)(in_RDI + 0x9c) * local_18;
      }
      local_8 = local_18;
    }
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

size_t ManagedBuffer<T>::size() {

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    return data.size();
    break;

  case CanonicalDataSource::NeedsCompute:
    return 0;
    break;

  case CanonicalDataSource::RenderBuffer:
    if (deviceBufferType == DeviceBufferType::Attribute) {
      return renderAttributeBuffer->getDataSize();
    } else {
      size_t s = 1;
      if (sizeX > 0) s *= sizeX;
      if (sizeY > 0) s *= sizeY;
      if (sizeZ > 0) s *= sizeZ;
      return s;
    }
    break;
  };

  return INVALID_IND;
}